

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht.c
# Opt level: O0

int ht_set(lgx_ht_t *ht,lgx_ht_node_t *node)

{
  int iVar1;
  uint uVar2;
  lgx_ht_node_t *local_30;
  lgx_ht_node_t *next;
  uint pos;
  lgx_ht_node_t *node_local;
  lgx_ht_t *ht_local;
  
  uVar2 = node->hash % ht->size;
  if (ht->table[uVar2] == (lgx_ht_node_t *)0x0) {
    node->next = (lgx_ht_node_s *)0x0;
    ht->table[uVar2] = node;
  }
  else {
    for (local_30 = ht->table[uVar2]; local_30 != (lgx_ht_node_t *)0x0; local_30 = local_30->next) {
      iVar1 = lgx_str_cmp(&node->k,&local_30->k);
      if (iVar1 == 0) {
        return 1;
      }
    }
    node->next = ht->table[uVar2];
    ht->table[uVar2] = node;
  }
  ht->length = ht->length + 1;
  if (ht->tail == (lgx_ht_node_t *)0x0) {
    ht->head = node;
    ht->tail = node;
  }
  else {
    ht->tail->order = node;
    ht->tail = node;
  }
  return 0;
}

Assistant:

static int ht_set(lgx_ht_t* ht, lgx_ht_node_t* node) {
    unsigned pos = node->hash % ht->size;

    // 插入位置是空的
    if (!ht->table[pos]) {
        node->next = NULL;
        ht->table[pos] = node;
    } else {
        lgx_ht_node_t* next = ht->table[pos];
        while (next) {
            if (lgx_str_cmp(&node->k, &next->k) == 0) {
                // 键已存在
                return 1;
            }
            next = next->next;
        }

        // 插入到链表头部
        node->next = ht->table[pos];
        ht->table[pos] = node;
    }

    ++ ht->length;

    if (!ht->tail) {
        ht->head = node;
        ht->tail = node;
    } else {
        ht->tail->order = node;
        ht->tail = node;
    }

    return 0;
}